

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O0

void round_shift_4x4(__m128i *in,int shift)

{
  int iVar1;
  undefined1 auVar2 [16];
  char local_13c;
  int local_128;
  int iStack_124;
  int iStack_120;
  int iStack_11c;
  int local_108;
  int iStack_104;
  int iStack_100;
  int iStack_fc;
  int local_e8;
  int iStack_e4;
  int iStack_e0;
  int iStack_dc;
  int local_c8;
  int iStack_c4;
  int iStack_c0;
  int iStack_bc;
  int local_a8;
  int iStack_a4;
  int iStack_a0;
  int iStack_9c;
  int iStack_88;
  int iStack_84;
  __m128i rnding;
  int iStack_68;
  int shift_local;
  __m128i *in_local;
  int local_48;
  int iStack_44;
  int iStack_40;
  int iStack_3c;
  
  if (shift != 0) {
    local_13c = (char)shift;
    iVar1 = 1 << (local_13c - 1U & 0x1f);
    local_48 = (int)(*in)[0];
    iStack_44 = (int)((ulong)(*in)[0] >> 0x20);
    iStack_40 = (int)(*in)[1];
    iStack_3c = (int)((ulong)(*in)[1] >> 0x20);
    *(int *)*in = local_48 + iVar1;
    *(int *)((long)*in + 4) = iStack_44 + iVar1;
    *(int *)(*in + 1) = iStack_40 + iVar1;
    *(int *)((long)*in + 0xc) = iStack_3c + iVar1;
    iStack_68 = (int)in[1][0];
    shift_local = (int)((ulong)in[1][0] >> 0x20);
    in_local._0_4_ = (int)in[1][1];
    in_local._4_4_ = (int)((ulong)in[1][1] >> 0x20);
    *(int *)in[1] = iStack_68 + iVar1;
    *(int *)((long)in[1] + 4) = shift_local + iVar1;
    *(int *)(in[1] + 1) = (int)in_local + iVar1;
    *(int *)((long)in[1] + 0xc) = in_local._4_4_ + iVar1;
    iStack_88 = (int)in[2][0];
    iStack_84 = (int)((ulong)in[2][0] >> 0x20);
    rnding[0]._0_4_ = (int)in[2][1];
    rnding[0]._4_4_ = (int)((ulong)in[2][1] >> 0x20);
    *(int *)in[2] = iStack_88 + iVar1;
    *(int *)((long)in[2] + 4) = iStack_84 + iVar1;
    *(int *)(in[2] + 1) = (int)rnding[0] + iVar1;
    *(int *)((long)in[2] + 0xc) = rnding[0]._4_4_ + iVar1;
    local_a8 = (int)in[3][0];
    iStack_a4 = (int)((ulong)in[3][0] >> 0x20);
    iStack_a0 = (int)in[3][1];
    iStack_9c = (int)((ulong)in[3][1] >> 0x20);
    *(int *)in[3] = local_a8 + iVar1;
    *(int *)((long)in[3] + 4) = iStack_a4 + iVar1;
    *(int *)(in[3] + 1) = iStack_a0 + iVar1;
    *(int *)((long)in[3] + 0xc) = iStack_9c + iVar1;
    local_c8 = (int)(*in)[0];
    iStack_c4 = (int)((ulong)(*in)[0] >> 0x20);
    iStack_c0 = (int)(*in)[1];
    iStack_bc = (int)((ulong)(*in)[1] >> 0x20);
    auVar2 = ZEXT416((uint)shift);
    *(int *)*in = local_c8 >> auVar2;
    *(int *)((long)*in + 4) = iStack_c4 >> auVar2;
    *(int *)(*in + 1) = iStack_c0 >> auVar2;
    *(int *)((long)*in + 0xc) = iStack_bc >> auVar2;
    local_e8 = (int)in[1][0];
    iStack_e4 = (int)((ulong)in[1][0] >> 0x20);
    iStack_e0 = (int)in[1][1];
    iStack_dc = (int)((ulong)in[1][1] >> 0x20);
    auVar2 = ZEXT416((uint)shift);
    *(int *)in[1] = local_e8 >> auVar2;
    *(int *)((long)in[1] + 4) = iStack_e4 >> auVar2;
    *(int *)(in[1] + 1) = iStack_e0 >> auVar2;
    *(int *)((long)in[1] + 0xc) = iStack_dc >> auVar2;
    local_108 = (int)in[2][0];
    iStack_104 = (int)((ulong)in[2][0] >> 0x20);
    iStack_100 = (int)in[2][1];
    iStack_fc = (int)((ulong)in[2][1] >> 0x20);
    auVar2 = ZEXT416((uint)shift);
    *(int *)in[2] = local_108 >> auVar2;
    *(int *)((long)in[2] + 4) = iStack_104 >> auVar2;
    *(int *)(in[2] + 1) = iStack_100 >> auVar2;
    *(int *)((long)in[2] + 0xc) = iStack_fc >> auVar2;
    local_128 = (int)in[3][0];
    iStack_124 = (int)((ulong)in[3][0] >> 0x20);
    iStack_120 = (int)in[3][1];
    iStack_11c = (int)((ulong)in[3][1] >> 0x20);
    auVar2 = ZEXT416((uint)shift);
    *(int *)in[3] = local_128 >> auVar2;
    *(int *)((long)in[3] + 4) = iStack_124 >> auVar2;
    *(int *)(in[3] + 1) = iStack_120 >> auVar2;
    *(int *)((long)in[3] + 0xc) = iStack_11c >> auVar2;
  }
  return;
}

Assistant:

static inline void round_shift_4x4(__m128i *in, int shift) {
  if (shift != 0) {
    __m128i rnding = _mm_set1_epi32(1 << (shift - 1));
    in[0] = _mm_add_epi32(in[0], rnding);
    in[1] = _mm_add_epi32(in[1], rnding);
    in[2] = _mm_add_epi32(in[2], rnding);
    in[3] = _mm_add_epi32(in[3], rnding);

    in[0] = _mm_srai_epi32(in[0], shift);
    in[1] = _mm_srai_epi32(in[1], shift);
    in[2] = _mm_srai_epi32(in[2], shift);
    in[3] = _mm_srai_epi32(in[3], shift);
  }
}